

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

boolean start_timer(level *lev,long when,short kind,short func_index,void *arg)

{
  timer_element *ptVar1;
  timer_element *ptVar2;
  timer_element *ptVar3;
  uint uVar4;
  
  if (5 < (ushort)func_index) {
    panic("start_timer");
  }
  ptVar1 = (timer_element *)malloc(0x20);
  ptVar1->next = (timer_element *)0x0;
  ptVar1->arg = (void *)0x0;
  ptVar1->timeout = 0;
  ptVar1->tid = 0;
  ptVar1->kind = 0;
  ptVar1->func_index = '\0';
  *(undefined5 *)&ptVar1->field_0x1b = 0;
  uVar4 = timer_id + 1;
  ptVar1->tid = timer_id;
  timer_id = uVar4;
  uVar4 = (int)when + moves;
  ptVar1->timeout = uVar4;
  ptVar1->kind = kind;
  ptVar1->field_0x1b = ptVar1->field_0x1b & 0xfe;
  ptVar1->func_index = (uchar)func_index;
  ptVar1->arg = arg;
  ptVar2 = lev->lev_timers;
  if ((ptVar2 == (timer_element *)0x0) || (uVar4 <= ptVar2->timeout)) {
    ptVar3 = (timer_element *)0x0;
  }
  else {
    do {
      ptVar3 = ptVar2;
      ptVar2 = ptVar3->next;
      if (ptVar2 == (timer_element *)0x0) break;
    } while (ptVar2->timeout < uVar4);
  }
  ptVar1->next = ptVar2;
  ptVar2 = (timer_element *)&lev->lev_timers;
  if (ptVar3 != (timer_element *)0x0) {
    ptVar2 = ptVar3;
  }
  ptVar2->next = ptVar1;
  if (kind == 2) {
    *(char *)((long)arg + 0x49) = *(char *)((long)arg + 0x49) + '\x01';
  }
  return '\x01';
}

Assistant:

boolean start_timer(struct level *lev, long when, short kind, short func_index,void *arg)
{
    timer_element *gnu;

    if (func_index < 0 || func_index >= NUM_TIME_FUNCS)
	panic("start_timer");

    gnu = malloc(sizeof(timer_element));
    memset(gnu, 0, sizeof(timer_element));
    gnu->next = NULL;
    gnu->tid = timer_id++;
    gnu->timeout = moves + when;
    gnu->kind = kind;
    gnu->needs_fixup = FALSE;
    gnu->func_index = func_index;
    gnu->arg = arg;
    insert_timer(lev, gnu);

    if (kind == TIMER_OBJECT)	/* increment object's timed count */
	((struct obj *)arg)->timed++;

    /* should check for duplicates and fail if any */
    return TRUE;
}